

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

uchar * __thiscall
CVmRun::do_call(CVmRun *this,uint caller_ofs,uchar *target_ptr,uint argc,vm_rcdesc *recurse_ctx)

{
  ushort uVar1;
  vm_datatype_t *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vm_val_t *pvVar6;
  vm_val_t *ret;
  vm_val_t *pvVar7;
  uchar *puVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  pvVar7 = sp_;
  r0_.typ = VM_NIL;
  if ((this->super_CVmStack).max_depth_ <
      (ulong)*(ushort *)(target_ptr + 4) + ((long)sp_ - (long)(this->super_CVmStack).arr_ >> 4) +
      0xb) {
    err_throw(0x8ff);
  }
  uVar1 = *(ushort *)(target_ptr + 2);
  pvVar2 = &sp_->typ;
  sp_ = sp_ + (ulong)uVar1 + 6;
  *pvVar2 = VM_NIL;
  pvVar7[1].typ = VM_CODEPTR;
  pvVar7[1].val.native_desc = (CVmNativeCodeDesc *)recurse_ctx;
  pvVar7[2].typ = VM_CODEOFS;
  pvVar7[2].val.obj = caller_ofs;
  puVar8 = entry_ptr_native_;
  pvVar7[3].typ = VM_CODEPTR;
  pvVar7[3].val.ptr = puVar8;
  pvVar7[4].typ = VM_INT;
  pvVar7[4].val.obj = argc;
  pvVar6 = frame_ptr_;
  pvVar7[5].typ = VM_STACK;
  pvVar7[5].val.native_desc = (CVmNativeCodeDesc *)pvVar6;
  auVar5 = _DAT_002c4b80;
  auVar4 = _DAT_002c4b70;
  auVar3 = _DAT_002c4b60;
  uVar11 = *target_ptr & 0x7f;
  if ((((int)argc < (int)uVar11) || (target_ptr[1] + uVar11 < argc)) &&
     ((-1 < (char)*target_ptr || ((int)argc <= (int)uVar11)))) {
    if (recurse_ctx != (vm_rcdesc *)0x0) {
      err_throw_a(0x89a,1,3,recurse_ctx->name);
    }
    err_throw(0x899);
  }
  frame_ptr_ = pvVar7 + 6;
  entry_ptr_native_ = target_ptr;
  if ((ulong)uVar1 != 0) {
    lVar10 = (ulong)uVar1 - 1;
    auVar12._8_4_ = (int)lVar10;
    auVar12._0_8_ = lVar10;
    auVar12._12_4_ = (int)((ulong)lVar10 >> 0x20);
    pvVar7 = pvVar7 + 9;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_002c4b80;
    do {
      auVar14._8_4_ = (int)uVar9;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pvVar7[-3].typ = VM_NIL;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pvVar7[-2].typ = VM_NIL;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        pvVar7[-1].typ = VM_NIL;
        pvVar7->typ = VM_NIL;
      }
      uVar9 = uVar9 + 4;
      pvVar7 = pvVar7 + 4;
    } while ((uVar1 + 3 & 0xfffffffc) != uVar9);
  }
  puVar8 = target_ptr + this->funchdr_size_;
  if (caller_ofs == 0) {
    run(this,puVar8);
    puVar8 = (uchar *)0x0;
  }
  return puVar8;
}

Assistant:

const uchar *CVmRun::compute_sum_inc(VMG_ const uchar *p)
{
    /* add 1 to the value at TOS, leaving it on the stack */
    vm_val_t val2;
    val2.set_int(1);
    if (compute_sum(vmg_ get(0), &val2))
    {
        return p;
    }
    else
    {
        /* no native implementation - check for an overload */
        vm_val_t val;
        pop(&val);
        push(&val2);
        return op_overload(vmg_ p - entry_ptr_native_, -1,
                           &val, G_predef->operator_add, 1,
                           VMERR_BAD_TYPE_ADD);
    }
}